

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_classes.cpp
# Opt level: O2

void test_classes(void)

{
  bool bVar1;
  duk_idx_t dVar2;
  duk_context *ctx;
  Dog *pDVar3;
  reference ppDVar4;
  ostream *poVar5;
  uint i;
  size_type __n;
  initializer_list<Dog_*> __l;
  allocator_type local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  vector<Dog_*,_std::allocator<Dog_*>_> dogs;
  string local_a8;
  string local_88;
  string local_68;
  Dog *local_48;
  Dog *local_40;
  Dog *local_38;
  
  ctx = duk_create_heap((duk_alloc_function)0x0,(duk_realloc_function)0x0,(duk_free_function)0x0,
                        (void *)0x0,(duk_fatal_function)0x0);
  dukglue_register_constructor<Dog,std::__cxx11::string_const&>(ctx,"Dog");
  dukglue_register_method<true,Dog,std::__cxx11::string_const&>(ctx,0x116360,(char *)0x0);
  dukglue_register_method<false,Dog,void,std::__cxx11::string_const&>(ctx,0x116364,(char *)0x0);
  dukglue_register_method<false,Dog,void,bool>(ctx,0x11629c,(char *)0x0);
  dukglue_register_method<false,Dog,int>(ctx,0x11636a,(char *)0x0);
  test_eval(ctx,"var test = new Dog(\'Gus\');");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getName();","Gus");
  test_eval(ctx,"test.rename(\'Archie\');");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getName();","Archie");
  dukglue_register_function<void,Dog*>(ctx,pokeWithStick,"pokeWithStick");
  test_eval(ctx,"pokeWithStick(test);");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getBarkCount();",1);
  dukglue_register_constructor<Goat>(ctx,"Goat");
  dukglue_register_delete<Goat>(ctx);
  test_eval(ctx,"var goat = new Goat();");
  duk_pop(ctx);
  test_eval_expect_error(ctx,"pokeWithStick(goat);");
  test_eval(ctx,"goat.delete()");
  duk_pop(ctx);
  dukglue_register_function<Dog*>(ctx,visitPuppy,"visitPuppy");
  test_eval(ctx,"var puppy = visitPuppy();");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.getName()","Sammie");
  test_eval(ctx,"pokeWithStick(puppy);");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.getBarkCount()",1);
  pDVar3 = visitPuppy();
  test_assert(pDVar3->bark_count_ == 1);
  test_eval(ctx,"puppy.dynamicfield = 4;");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.dynamicfield",4);
  test_eval(ctx,"puppy = null; puppy = visitPuppy();");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.dynamicfield",4);
  dukglue_register_delete<Dog>(ctx);
  test_eval(ctx,"var myPuppy = new Dog(\'Squirt\');");
  test_eval(ctx,"pokeWithStick(myPuppy);");
  test_eval(ctx,"myPuppy.delete();");
  duk_pop_3(ctx);
  test_eval_expect_error(ctx,"myPuppy.bark();");
  test_eval_expect_error(ctx,"pokeWithStick(myPuppy);");
  test_eval_expect_error(ctx,"myPuppy.delete();");
  test_eval(ctx,"test.delete()");
  duk_pop(ctx);
  pDVar3 = (Dog *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Gus",&local_c1);
  Dog::Dog(pDVar3,&local_68);
  local_48 = pDVar3;
  pDVar3 = (Dog *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Sammy",&local_c2);
  Dog::Dog(pDVar3,&local_88);
  local_40 = pDVar3;
  pDVar3 = (Dog *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Zoey",&local_c3);
  Dog::Dog(pDVar3,&local_a8);
  __l._M_len = 3;
  __l._M_array = &local_48;
  local_38 = pDVar3;
  std::vector<Dog_*,_std::allocator<Dog_*>_>::vector(&dogs,__l,&local_c4);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
  push<std::vector<Dog*,std::allocator<Dog*>>>(ctx,&dogs);
  if (dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data._M_finish
         = dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  dukglue_read<std::vector<Dog*,std::allocator<Dog*>>>(ctx,-1,&dogs);
  duk_pop(ctx);
  test_assert((long)dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x18);
  ppDVar4 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at(&dogs,0);
  bVar1 = std::operator==(&(*ppDVar4)->name_,"Gus");
  test_assert(bVar1);
  ppDVar4 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at(&dogs,1);
  bVar1 = std::operator==(&(*ppDVar4)->name_,"Sammy");
  test_assert(bVar1);
  ppDVar4 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at(&dogs,2);
  bVar1 = std::operator==(&(*ppDVar4)->name_,"Zoey");
  test_assert(bVar1);
  for (__n = 0; __n != 3; __n = __n + 1) {
    ppDVar4 = std::vector<Dog_*,_std::allocator<Dog_*>_>::at(&dogs,__n);
    pDVar3 = *ppDVar4;
    if (pDVar3 != (Dog *)0x0) {
      Dog::~Dog(pDVar3);
    }
    operator_delete(pDVar3,0x28);
  }
  std::_Vector_base<Dog_*,_std::allocator<Dog_*>_>::~_Vector_base
            (&dogs.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>);
  dVar2 = duk_get_top(ctx);
  test_assert(dVar2 == 0);
  duk_destroy_heap(ctx);
  poVar5 = std::operator<<((ostream *)&std::cout,"Classes tested OK");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void test_classes() {
	duk_context* ctx = duk_create_heap_default();

	// - dukglue_register_constructor with arguments
	// - dukglue_register_method (const and non-const)
	dukglue_register_constructor<Dog, const std::string&>(ctx, "Dog");
	dukglue_register_method(ctx, &Dog::getName, "getName");  // const method
	dukglue_register_method(ctx, &Dog::rename, "rename");
	dukglue_register_method(ctx, &Dog::bark, "bark");
	dukglue_register_method(ctx, &Dog::getBarkCount, "getBarkCount");

	// - test that script can actually call constructor + methods
	test_eval(ctx, "var test = new Dog('Gus');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Gus");
	test_eval(ctx, "test.rename('Archie');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Archie");

	// - test native objects as arguments to native functions
	dukglue_register_function(ctx, pokeWithStick, "pokeWithStick");
	test_eval(ctx, "pokeWithStick(test);");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getBarkCount();", 1);

	// - test type-safety when passing native types
	dukglue_register_constructor<Goat>(ctx, "Goat");
	dukglue_register_delete<Goat>(ctx);
	test_eval(ctx, "var goat = new Goat();");
	duk_pop(ctx);
	test_eval_expect_error(ctx, "pokeWithStick(goat);");
	test_eval(ctx, "goat.delete()");
	duk_pop(ctx);

	// - test that objects can be passed from C++ to script correctly
	dukglue_register_function(ctx, visitPuppy, "visitPuppy");
	test_eval(ctx, "var puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getName()", "Sammie");
	test_eval(ctx, "pokeWithStick(puppy);");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getBarkCount()", 1);
	test_assert(visitPuppy()->getBarkCount() == 1);

	// - test that dynamic fields persist when passing the same native object twice
	test_eval(ctx, "puppy.dynamicfield = 4;");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);
	test_eval(ctx, "puppy = null; puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);

	// - test that references are properly invalidated by obj.delete()
	dukglue_register_delete<Dog>(ctx);
	test_eval(ctx, "var myPuppy = new Dog('Squirt');");
	test_eval(ctx, "pokeWithStick(myPuppy);");
	test_eval(ctx, "myPuppy.delete();");
	duk_pop_3(ctx);
	test_eval_expect_error(ctx, "myPuppy.bark();");
	test_eval_expect_error(ctx, "pokeWithStick(myPuppy);");
	test_eval_expect_error(ctx, "myPuppy.delete();");
	test_eval(ctx, "test.delete()");
	duk_pop(ctx);

	// std::vector<Cls*>
	{
		std::vector<Dog*> dogs = { new Dog("Gus"), new Dog("Sammy"), new Dog("Zoey") };
		dukglue_push(ctx, dogs);

		dogs.clear();
		dukglue_read(ctx, -1, &dogs);
		duk_pop(ctx);

		test_assert(dogs.size() == 3);
		test_assert(dogs.at(0)->getName() == "Gus");
		test_assert(dogs.at(1)->getName() == "Sammy");
		test_assert(dogs.at(2)->getName() == "Zoey");

		for (unsigned int i = 0; i < 3; i++)
			delete dogs.at(i);
	}

	test_assert(duk_get_top(ctx) == 0);
	duk_destroy_heap(ctx);

	std::cout << "Classes tested OK" << std::endl;
}